

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetIntValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  bool bVar3;
  char *pcVar4;
  undefined8 uVar5;
  string local_190 [8];
  string dump;
  TemplateString local_170;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"test_SetIntValue");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString(&local_d0,"INT");
  TVar1.length_ = local_d0.length_;
  TVar1.ptr_ = local_d0.ptr_;
  TVar1.is_immutable_ = local_d0.is_immutable_;
  TVar1._17_7_ = local_d0._17_7_;
  TVar1.id_ = local_d0.id_;
  ctemplate::TemplateDictionary::SetIntValue(TVar1,(long)local_78);
  ctemplate::TemplateString::TemplateString(&local_f0,"-INT");
  TVar2.length_ = local_f0.length_;
  TVar2.ptr_ = local_f0.ptr_;
  TVar2.is_immutable_ = local_f0.is_immutable_;
  TVar2._17_7_ = local_f0._17_7_;
  TVar2.id_ = local_f0.id_;
  ctemplate::TemplateDictionary::SetIntValue(TVar2,(long)local_78);
  ctemplate::TemplateString::TemplateString(&local_110,"INT");
  ctemplate::TemplateString::TemplateString(&local_130,"5");
  bVar3 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_110,&local_130);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"INT\", \"5\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_150,"-INT");
  ctemplate::TemplateString::TemplateString(&local_170,"-5");
  bVar3 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_150,&local_170);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"-INT\", \"-5\")");
    exit(1);
  }
  std::__cxx11::string::string(local_190);
  ctemplate::TemplateDictionary::DumpToString((string *)local_78,(int)local_190);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar4 = strstr(pcVar4,"\n   INT: >5<\n");
  if (pcVar4 == (char *)0x0) {
    uVar5 = std::__cxx11::string::c_str();
    printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
           ,0xca,"\n   INT: >5<\n",uVar5);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strstr(pcVar4,"\n   INT: >5<\n");
    if (pcVar4 != (char *)0x0) {
      exit(1);
    }
    __assert_fail("strstr((dump.c_str()), (\"\\n   INT: >5<\\n\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                  ,0xca,
                  "static void (anonymous namespace)::Test_TemplateDictionary_SetIntValue::Run()");
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar4 = strstr(pcVar4,"\n   -INT: >-5<\n");
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::~string(local_190);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  uVar5 = std::__cxx11::string::c_str();
  printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
         ,0xcb,"\n   -INT: >-5<\n",uVar5);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar4 = strstr(pcVar4,"\n   -INT: >-5<\n");
  if (pcVar4 != (char *)0x0) {
    exit(1);
  }
  __assert_fail("strstr((dump.c_str()), (\"\\n   -INT: >-5<\\n\"))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                ,0xcb,
                "static void (anonymous namespace)::Test_TemplateDictionary_SetIntValue::Run()");
}

Assistant:

TEST(TemplateDictionary, SetIntValue) {
  TemplateDictionary dict("test_SetIntValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetIntValue("INT", 5);
  // - is an illegal varname in templates, but perfectly fine in dicts
  dict.SetIntValue("-INT", -5);

  EXPECT_TRUE(peer.ValueIs("INT", "5"));
  EXPECT_TRUE(peer.ValueIs("-INT", "-5"));
  string dump;
  dict.DumpToString(&dump);
  ASSERT_STRSTR(dump.c_str(), "\n   INT: >5<\n");
  ASSERT_STRSTR(dump.c_str(), "\n   -INT: >-5<\n");

}